

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O0

void __thiscall sznet::CountDownLatch::countDown(CountDownLatch *this)

{
  MutexLockGuard local_18;
  MutexLockGuard lock;
  CountDownLatch *this_local;
  
  lock.m_mutex = (MutexLock *)this;
  MutexLockGuard::MutexLockGuard(&local_18,&this->m_mutex);
  this->m_count = this->m_count + -1;
  if (this->m_count == 0) {
    Condition::notifyAll(&this->m_condition);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return;
}

Assistant:

void CountDownLatch::countDown()
{
	MutexLockGuard lock(m_mutex);
	--m_count;
	if (m_count == 0)
	{
		m_condition.notifyAll();
	}
}